

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O3

string * cmCurlSetNETRCOption
                   (string *__return_storage_ptr__,CURL *curl,string *netrc_level,string *netrc_file
                   )

{
  int iVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (netrc_level->_M_string_length != 0) {
    iVar1 = std::__cxx11::string::compare((char *)netrc_level);
    if (iVar1 == 0) {
      uVar3 = 1;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)netrc_level);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)netrc_level);
        if (iVar1 == 0) {
          return __return_storage_ptr__;
        }
        local_38 = (netrc_level->_M_dataplus)._M_p;
        local_40 = netrc_level->_M_string_length;
        local_50._M_len = 0x35;
        local_50._M_str = "NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ";
        views._M_len = 2;
        views._M_array = &local_50;
        cmCatViews_abi_cxx11_(&local_70,views);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      uVar3 = 2;
    }
    CVar2 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC,uVar3);
    if ((CVar2 & ~CURLE_NOT_BUILT_IN) != CURLE_OK) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (((__return_storage_ptr__->_M_string_length == 0) && (netrc_file->_M_string_length != 0)) &&
       (CVar2 = curl_easy_setopt((Curl_easy *)curl,CURLOPT_NETRC_FILE,(netrc_file->_M_dataplus)._M_p
                                ), (CVar2 & ~CURLE_NOT_BUILT_IN) != CURLE_OK)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      curl_easy_strerror(CVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCurlSetNETRCOption(::CURL* curl, const std::string& netrc_level,
                                 const std::string& netrc_file)
{
  std::string e;
  CURL_NETRC_OPTION curl_netrc_level = CURL_NETRC_LAST;
  ::CURLcode res;

  if (!netrc_level.empty()) {
    if (netrc_level == "OPTIONAL") {
      curl_netrc_level = CURL_NETRC_OPTIONAL;
    } else if (netrc_level == "REQUIRED") {
      curl_netrc_level = CURL_NETRC_REQUIRED;
    } else if (netrc_level == "IGNORED") {
      curl_netrc_level = CURL_NETRC_IGNORED;
    } else {
      e = cmStrCat("NETRC accepts OPTIONAL, IGNORED or REQUIRED but got: ",
                   netrc_level);
      return e;
    }
  }

  if (curl_netrc_level != CURL_NETRC_LAST &&
      curl_netrc_level != CURL_NETRC_IGNORED) {
    res = ::curl_easy_setopt(curl, CURLOPT_NETRC, curl_netrc_level);
    check_curl_result(res, "Unable to set netrc level: ");
    if (!e.empty()) {
      return e;
    }

    // check to see if a .netrc file has been specified
    if (!netrc_file.empty()) {
      res = ::curl_easy_setopt(curl, CURLOPT_NETRC_FILE, netrc_file.c_str());
      check_curl_result(res, "Unable to set .netrc file path : ");
    }
  }
  return e;
}